

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_replay_linux.hpp
# Opt level: O1

void thread_callback(void *param_1)

{
  int iVar1;
  sigset_t mask;
  sigset_t sStack_88;
  
  iVar1 = sigaltstack((sigaltstack *)&alt_stack,(sigaltstack *)0x0);
  if (iVar1 < 0) {
    thread_callback();
  }
  sigemptyset(&sStack_88);
  iVar1 = pthread_sigmask(2,&sStack_88,(__sigset_t *)0x0);
  if (iVar1 < 0) {
    thread_callback();
  }
  return;
}

Assistant:

static void thread_callback(void *)
{
	// Alternate signal stacks set by sigaltstack are per-thread.
	// Need to install the alternate stack on all threads.
	if (sigaltstack(&alt_stack, nullptr) < 0)
		LOGE("Failed to install alternate stack.\n");

	// Don't block any signals in the worker threads.
	sigset_t mask;
	sigemptyset(&mask);
	if (pthread_sigmask(SIG_SETMASK, &mask, nullptr) < 0)
		LOGE("Failed to set signal mask.\n");
}